

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

int fl_add_symbol(char *name,_func_void_Fl_Color *drawit,int scalable)

{
  bool bVar1;
  int iVar2;
  int pos;
  int scalable_local;
  _func_void_Fl_Color *drawit_local;
  char *name_local;
  
  fl_init_symbols();
  bVar1 = symbnumb < 0x6a;
  if (bVar1) {
    iVar2 = find(name);
    symbols[iVar2].name = name;
    symbols[iVar2].drawit = drawit;
    symbols[iVar2].notempty = '\x01';
    symbols[iVar2].scalable = (char)scalable;
    symbnumb = symbnumb + 1;
  }
  name_local._4_4_ = (uint)bVar1;
  return name_local._4_4_;
}

Assistant:

int fl_add_symbol(const char *name, void (*drawit)(Fl_Color), int scalable)
{
  fl_init_symbols();
  int pos;
  if (symbnumb > MAXSYMBOL / 2) return 0;	// table is full
  pos = find(name);
  symbols[pos].name = name;
  symbols[pos].drawit = drawit;
  symbols[pos].notempty = 1;
  symbols[pos].scalable = scalable;
  symbnumb++;
  return 1;
}